

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allreduce.h
# Opt level: O3

void __thiscall node_socks::~node_socks(node_socks *this)

{
  pointer pcVar1;
  int iVar2;
  
  iVar2 = std::__cxx11::string::compare((char *)this);
  if (iVar2 != 0) {
    if (this->parent != -1) {
      close(this->parent);
    }
    if (this->children[0] != -1) {
      close(this->children[0]);
    }
    if (this->children[1] != -1) {
      close(this->children[1]);
    }
  }
  pcVar1 = (this->current_master)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->current_master).field_2) {
    operator_delete(pcVar1);
    return;
  }
  return;
}

Assistant:

~node_socks()
  {
    if (current_master != "")
    {
      if (parent != -1)
        CLOSESOCK(this->parent);
      if (children[0] != -1)
        CLOSESOCK(this->children[0]);
      if (children[1] != -1)
        CLOSESOCK(this->children[1]);
    }
  }